

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O3

void show_regs(void)

{
  char *pcVar1;
  FILE *pFVar2;
  byte bVar3;
  byte bVar4;
  
  fprintf((FILE *)output,"\nPC=%4X A =%02X ",(ulong)pc,(ulong)acc);
  fprintf((FILE *)output,"X=%02X Y=%02X S=%02X:%02X ",(ulong)x_reg,(ulong)y_reg,(ulong)sp,
          (ulong)RAM[(ulong)sp + 0x101]);
  fprintf((FILE *)output,"n%dv%db%dd%d",(ulong)((char)result_f < '\0' || except != '\0'),
          (ulong)(ovr_f != '\0'),(ulong)(brk_f != '\0'),(ulong)(dec_f != '\0'));
  fprintf((FILE *)output,"id%dz%dc%d",(ulong)(intd_f != '\0'),
          (ulong)(result_f == '\0' && except == '\0'),(ulong)(carry_f != '\0'));
  pFVar2 = output;
  bVar3 = getbyte(pc);
  pcVar1 = mnemonic[bVar3];
  bVar3 = getbyte(pc + 2);
  bVar4 = getbyte(pc + 1);
  fprintf((FILE *)pFVar2," %18s D=%2X%02X",pcVar1,(ulong)bVar3,(ulong)bVar4);
  pFVar2 = output;
  bVar3 = getbyte(pc);
  fprintf((FILE *)pFVar2," %02X",(ulong)bVar3);
  return;
}

Assistant:

void show_regs(void)      // debugging procedure to display misc status
// and registers.
{
    fprintf(output, "\nPC=%4X A =%02X ", pc, acc);
    fprintf(output, "X=%02X Y=%02X S=%02X:%02X ", x_reg, y_reg, sp, RAM[sp + 0x101]);
    fprintf(output, "n%dv%db%dd%d", ((except) || (result_f & 0x80)) ? 1 : 0, ovr_f == 0 ? 0 : 1, brk_f == 0 ? 0 : 1,
            dec_f == 0 ? 0 : 1);
    fprintf(output, "id%dz%dc%d", intd_f == 0 ? 0 : 1, (except || result_f) ? 0 : 1, carry_f == 0 ? 0 : 1);
    fprintf(output, " %18s D=%2X%02X", mnemonic[getbyte(pc)], getbyte(pc + 2), getbyte(pc + 1));
    fprintf(output, " %02X", getbyte(pc));
}